

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_queue.cpp
# Opt level: O0

void __thiscall
miniros::SubscriptionQueue::SubscriptionQueue
          (SubscriptionQueue *this,string *topic,int32_t queue_size,bool allow_concurrent_callbacks)

{
  byte in_CL;
  undefined4 in_EDX;
  string *in_RSI;
  CallbackInterface *in_RDI;
  
  CallbackInterface::CallbackInterface(in_RDI);
  std::enable_shared_from_this<miniros::SubscriptionQueue>::enable_shared_from_this
            ((enable_shared_from_this<miniros::SubscriptionQueue> *)0x4e5735);
  in_RDI->_vptr_CallbackInterface = (_func_int **)&PTR__SubscriptionQueue_0061fe58;
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RSI);
  *(undefined4 *)&in_RDI[7]._vptr_CallbackInterface = in_EDX;
  *(undefined1 *)((long)&in_RDI[7]._vptr_CallbackInterface + 4) = 0;
  std::mutex::mutex((mutex *)0x4e5774);
  std::deque<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>::
  deque((deque<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
         *)0x4e5781);
  *(undefined4 *)&in_RDI[0x17]._vptr_CallbackInterface = 0;
  *(byte *)((long)&in_RDI[0x17]._vptr_CallbackInterface + 4) = in_CL & 1;
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x4e57a9);
  return;
}

Assistant:

SubscriptionQueue::SubscriptionQueue(const std::string& topic, int32_t queue_size, bool allow_concurrent_callbacks)
: topic_(topic)
, size_(queue_size)
, full_(false)
, queue_size_(0)
, allow_concurrent_callbacks_(allow_concurrent_callbacks)
{}